

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O2

void __thiscall HEkkDual::minorUpdate(HEkkDual *this)

{
  double *pdVar1;
  HEkk *pHVar2;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  HighsInt i;
  long lVar7;
  long lVar8;
  double dVar9;
  
  iVar6 = this->multi_nFinish;
  pHVar2 = this->ekk_instance_;
  this->multi_finish[iVar6].move_in =
       (pHVar2->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
       _M_impl.super__Vector_impl_data._M_start[this->variable_in];
  this->multi_finish[iVar6].shiftOut =
       (pHVar2->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[this->variable_out];
  piVar3 = this->multi_finish[iVar6].flipList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->multi_finish[iVar6].flipList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    this->multi_finish[iVar6].flipList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  lVar8 = 0;
  for (lVar7 = 0; lVar7 < (this->dualRow).workCount; lVar7 = lVar7 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->multi_finish[iVar6].flipList,
               (value_type_conflict2 *)
               ((long)&((this->dualRow).workData.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar8));
    lVar8 = lVar8 + 0x10;
  }
  minorUpdateDual(this);
  minorUpdatePrimal(this);
  minorUpdatePivots(this);
  minorUpdateRows(this);
  if (this->minor_new_devex_framework != false) {
    minorInitialiseDevexFramework(this);
  }
  this->multi_nFinish = this->multi_nFinish + 1;
  iterationAnalysisMinor(this);
  uVar4 = 0;
  uVar5 = (ulong)(uint)this->multi_num;
  if (this->multi_num < 1) {
    uVar5 = uVar4;
  }
  iVar6 = 0;
  for (; uVar5 * 0x248 - uVar4 != 0; uVar4 = uVar4 + 0x248) {
    if (-1 < *(int *)((long)&this->multi_choice[0].row_out + uVar4)) {
      dVar9 = *(double *)((long)&this->multi_choice[0].infeasValue + uVar4) /
              *(double *)((long)&this->multi_choice[0].infeasEdWt + uVar4);
      pdVar1 = (double *)((long)&this->multi_choice[0].infeasLimit + uVar4);
      iVar6 = iVar6 + (uint)(*pdVar1 <= dVar9 && dVar9 != *pdVar1);
    }
  }
  if (iVar6 == 0) {
    this->multi_chooseAgain = 1;
  }
  return;
}

Assistant:

void HEkkDual::minorUpdate() {
  // Minor update - store roll back data
  MFinish* finish = &multi_finish[multi_nFinish];
  finish->move_in = ekk_instance_.basis_.nonbasicMove_[variable_in];
  finish->shiftOut = ekk_instance_.info_.workShift_[variable_out];
  finish->flipList.clear();
  for (HighsInt i = 0; i < dualRow.workCount; i++)
    finish->flipList.push_back(dualRow.workData[i].first);

  // Minor update - key parts
  minorUpdateDual();
  minorUpdatePrimal();
  minorUpdatePivots();
  minorUpdateRows();
  if (minor_new_devex_framework) {
    /*
    printf("Iter %7" HIGHSINT_FORMAT " (Major %7" HIGHSINT_FORMAT "): Minor new
    Devex framework\n", ekk_instance_.iteration_count_,
           multi_iteration);
    */
    minorInitialiseDevexFramework();
  }
  multi_nFinish++;
  // Analyse the iteration: possibly report; possibly switch strategy
  iterationAnalysisMinor();

  // Minor update - check for the next iteration
  HighsInt countRemain = 0;
  for (HighsInt i = 0; i < multi_num; i++) {
    HighsInt iRow = multi_choice[i].row_out;
    if (iRow < 0) continue;
    double myInfeas = multi_choice[i].infeasValue;
    double myWeight = multi_choice[i].infeasEdWt;
    countRemain += (myInfeas / myWeight > multi_choice[i].infeasLimit);
  }
  if (countRemain == 0) multi_chooseAgain = 1;
}